

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
readAuditing(void *handle,UA_NodeId nodeid,UA_Boolean sourceTimeStamp,UA_NumericRange *range,
            UA_DataValue *value)

{
  UA_Boolean *pUVar1;
  UA_DateTime UVar2;
  UA_Boolean *boolean;
  UA_DataValue *value_local;
  UA_NumericRange *range_local;
  UA_Boolean sourceTimeStamp_local;
  void *handle_local;
  
  if (range == (UA_NumericRange *)0x0) {
    (value->value).type = UA_TYPES;
    (value->value).arrayLength = 0;
    pUVar1 = UA_Boolean_new();
    *pUVar1 = false;
    (value->value).data = pUVar1;
    (value->value).arrayDimensionsSize = 0;
    (value->value).arrayDimensions = (UA_UInt32 *)0x0;
    *(byte *)value = *(byte *)value & 0xfe | 1;
    if (sourceTimeStamp) {
      *(byte *)value = *(byte *)value & 0xfb | 4;
      UVar2 = UA_DateTime_now();
      value->sourceTimestamp = UVar2;
    }
  }
  else {
    *(byte *)value = *(byte *)value & 0xfd | 2;
    value->status = 0x80360000;
  }
  return 0;
}

Assistant:

static UA_StatusCode
readAuditing(void *handle, const UA_NodeId nodeid, UA_Boolean sourceTimeStamp,
           const UA_NumericRange *range, UA_DataValue *value) {
    if(range) {
        value->hasStatus = true;
        value->status = UA_STATUSCODE_BADINDEXRANGEINVALID;
        return UA_STATUSCODE_GOOD;
    }

    value->value.type = &UA_TYPES[UA_TYPES_BOOLEAN];
    value->value.arrayLength = 0;
    UA_Boolean *boolean = UA_Boolean_new();
    *boolean = false;
    value->value.data = boolean;
    value->value.arrayDimensionsSize = 0;
    value->value.arrayDimensions = NULL;
    value->hasValue = true;
    if(sourceTimeStamp) {
        value->hasSourceTimestamp = true;
        value->sourceTimestamp = UA_DateTime_now();
    }
    return UA_STATUSCODE_GOOD;
}